

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_key.cpp
# Opt level: O2

Privkey * cfd::core::operator-(Privkey *__return_storage_ptr__,Privkey *left,Privkey *right)

{
  Privkey local_30;
  
  Privkey::Privkey(__return_storage_ptr__,left);
  Privkey::operator-=(&local_30,__return_storage_ptr__,right);
  ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&local_30);
  return __return_storage_ptr__;
}

Assistant:

Privkey operator-(const Privkey &left, const Privkey &right) {
  Privkey key = left;
  key -= right;
  return key;
}